

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::AccessInstrumenter::create(AccessInstrumenter *this)

{
  AccessInstrumenter *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::AccessInstrumenter,std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>&>
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
             &stack0xffffffffffffffe0);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::AccessInstrumenter,std::default_delete<wasm::AccessInstrumenter>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::AccessInstrumenter,_std::default_delete<wasm::AccessInstrumenter>_> *
             )&stack0xffffffffffffffe0);
  std::unique_ptr<wasm::AccessInstrumenter,_std::default_delete<wasm::AccessInstrumenter>_>::
  ~unique_ptr((unique_ptr<wasm::AccessInstrumenter,_std::default_delete<wasm::AccessInstrumenter>_>
               *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<AccessInstrumenter>(ignoreFunctions);
  }